

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptWeakMap * __thiscall Js::JavascriptLibrary::CreateWeakMap(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptWeakMap *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->weakMapType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1819,"(weakMapType)","Where\'s weakMapType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = (undefined1  [8])&JavascriptWeakMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x181a;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  this_00 = (JavascriptWeakMap *)new<Memory::Recycler>(0x60,alloc,0x39e810);
  JavascriptWeakMap::JavascriptWeakMap(this_00,(this->weakMapType).ptr);
  return this_00;
}

Assistant:

JavascriptWeakMap* JavascriptLibrary::CreateWeakMap()
    {
        AssertMsg(weakMapType, "Where's weakMapType?");
        return RecyclerNewFinalized(this->GetRecycler(), JavascriptWeakMap, weakMapType);
    }